

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

void dumpInfo(DataFieldInfo *info,Bounds iBounds,Bounds jBounds,Bounds kBounds,Bounds lBounds)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  string *psVar4;
  void *pvVar5;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  DataFieldInfo *local_30;
  DataFieldInfo *info_local;
  Bounds lBounds_local;
  Bounds kBounds_local;
  Bounds jBounds_local;
  Bounds iBounds_local;
  
  local_30 = info;
  info_local = (DataFieldInfo *)lBounds;
  lBounds_local = kBounds;
  kBounds_local = jBounds;
  jBounds_local = iBounds;
  local_34 = ser::DataFieldInfo::iSize(info);
  local_34 = local_34 + -1;
  piVar2 = std::min<int>(&jBounds_local.upper,&local_34);
  jBounds_local.upper = *piVar2;
  local_38 = ser::DataFieldInfo::jSize(local_30);
  local_38 = local_38 + -1;
  piVar2 = std::min<int>(&kBounds_local.upper,&local_38);
  kBounds_local.upper = *piVar2;
  local_3c = ser::DataFieldInfo::kSize(local_30);
  local_3c = local_3c + -1;
  piVar2 = std::min<int>(&lBounds_local.upper,&local_3c);
  lBounds_local.upper = *piVar2;
  local_40 = ser::DataFieldInfo::lSize(local_30);
  local_40 = local_40 + -1;
  piVar2 = std::min<int>((int *)((long)&info_local + 4),&local_40);
  info_local = (DataFieldInfo *)CONCAT44(*piVar2,info_local._0_4_);
  poVar3 = std::operator<<((ostream *)&std::cout,"Field: ");
  psVar4 = ser::DataFieldInfo::name_abi_cxx11_(local_30);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Type: ");
  psVar4 = ser::DataFieldInfo::type_abi_cxx11_(local_30);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Rank: ");
  iVar1 = ser::DataFieldInfo::rank(local_30);
  pvVar5 = (void *)std::ostream::operator<<(poVar3,iVar1);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Bytes per Element: ");
  iVar1 = ser::DataFieldInfo::bytesPerElement(local_30);
  pvVar5 = (void *)std::ostream::operator<<(poVar3,iVar1);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"iSize: ");
  iVar1 = ser::DataFieldInfo::iSize(local_30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = operator<<(poVar3,&jBounds_local);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"jSize: ");
  iVar1 = ser::DataFieldInfo::jSize(local_30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = operator<<(poVar3,&kBounds_local);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"kSize: ");
  iVar1 = ser::DataFieldInfo::kSize(local_30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = operator<<(poVar3,&lBounds_local);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"lSize: ");
  iVar1 = ser::DataFieldInfo::lSize(local_30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = operator<<(poVar3,(Bounds *)&info_local);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void dumpInfo(const DataFieldInfo& info, Bounds iBounds, Bounds jBounds, Bounds kBounds, Bounds lBounds)
{
	iBounds.upper = std::min(iBounds.upper, info.iSize() - 1);
	jBounds.upper = std::min(jBounds.upper, info.jSize() - 1);
	kBounds.upper = std::min(kBounds.upper, info.kSize() - 1);
	lBounds.upper = std::min(lBounds.upper, info.lSize() - 1);

	std::cout << "Field: " << info.name() << std::endl;
	std::cout << "Type: " << info.type() << std::endl;
	std::cout << "Rank: " << info.rank() << std::endl;
	std::cout << "Bytes per Element: " << info.bytesPerElement() << std::endl;
	std::cout << "iSize: " << info.iSize() << " " << iBounds << std::endl;
	std::cout << "jSize: " << info.jSize() << " " << jBounds << std::endl;
	std::cout << "kSize: " << info.kSize() << " " << kBounds << std::endl;
	std::cout << "lSize: " << info.lSize() << " " << lBounds << std::endl;
}